

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

int usage(char *name)

{
  undefined8 in_RDI;
  
  printf("Usage: %s mybios.rom [-c XX] [-s strap]\n",in_RDI);
  printf("Options:\n");
  printf("  -c XX : override card generation\n");
  printf("  -m XX : set tCWL (for timing entry size < 20)\n");
  printf("  -s XX : set the trap register\n");
  printf("  -i XXXX : print init script at XXXX and exit\n");
  return 1;
}

Assistant:

int usage(char* name) {
	printf("Usage: %s mybios.rom [-c XX] [-s strap]\n",name);
	printf("Options:\n");
	printf("  -c XX : override card generation\n");
	printf("  -m XX : set tCWL (for timing entry size < 20)\n");
	printf("  -s XX : set the trap register\n");
	printf("  -i XXXX : print init script at XXXX and exit\n");
	return 1;
}